

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

TokenType __thiscall
google::protobuf::util::converter::JsonStreamParser::GetNextTokenType(JsonStreamParser *this)

{
  int iVar1;
  char *offset;
  bool bVar2;
  char cVar3;
  long len;
  StringPiece prefix;
  StringPiece prefix_00;
  StringPiece prefix_01;
  StringPiece local_40;
  undefined1 local_30 [8];
  StringPiece data_view;
  
  SkipWhitespace(this);
  iVar1 = (int)(this->p_).length_;
  if (iVar1 != 0) {
    offset = (this->p_).ptr_;
    len = (long)iVar1;
    StringPiece::StringPiece((StringPiece *)local_30,offset,len);
    cVar3 = *offset;
    if (cVar3 == '\"') {
      return BEGIN_STRING;
    }
    if (cVar3 == '\'') {
      return BEGIN_STRING;
    }
    if ((cVar3 == '-') || ((byte)(cVar3 - 0x30U) < 10)) {
      return BEGIN_NUMBER;
    }
    if ((DAT_003f2df0 <= len) &&
       (prefix.length_ = DAT_003f2df0, prefix.ptr_ = kKeywordTrue,
       bVar2 = HasPrefixString(_local_30,prefix), bVar2)) {
      return BEGIN_TRUE;
    }
    if ((DAT_003f2e00 <= len) &&
       (prefix_00.length_ = DAT_003f2e00, prefix_00.ptr_ = kKeywordFalse,
       bVar2 = HasPrefixString(_local_30,prefix_00), bVar2)) {
      return BEGIN_FALSE;
    }
    if ((DAT_003f2e10 <= len) &&
       (prefix_01.length_ = DAT_003f2e10, prefix_01.ptr_ = kKeywordNull,
       bVar2 = HasPrefixString(_local_30,prefix_01), bVar2)) {
      return BEGIN_NULL;
    }
    cVar3 = *offset;
    if (cVar3 == ',') {
      return VALUE_SEPARATOR;
    }
    if (cVar3 == ':') {
      return ENTRY_SEPARATOR;
    }
    if (cVar3 == '[') {
      return BEGIN_ARRAY;
    }
    if (cVar3 == ']') {
      return END_ARRAY;
    }
    if (cVar3 == '{') {
      return BEGIN_OBJECT;
    }
    if (cVar3 == '}') {
      return END_OBJECT;
    }
    local_40.ptr_ = (this->p_).ptr_;
    local_40.length_ = (this->p_).length_;
    if (local_40.length_ != 0) {
      cVar3 = StringPiece::operator[](&local_40,0);
      bVar2 = IsLetter(cVar3);
      return UNKNOWN - bVar2;
    }
  }
  return UNKNOWN;
}

Assistant:

JsonStreamParser::TokenType JsonStreamParser::GetNextTokenType() {
  SkipWhitespace();

  int size = p_.size();
  if (size == 0) {
    // If we ran out of data, report unknown and we'll place the previous parse
    // type onto the stack and try again when we have more data.
    return UNKNOWN;
  }
  // TODO(sven): Split this method based on context since different contexts
  // support different tokens. Would slightly speed up processing?
  const char* data = p_.data();
  StringPiece data_view = StringPiece(data, size);
  if (*data == '\"' || *data == '\'') return BEGIN_STRING;
  if (*data == '-' || ('0' <= *data && *data <= '9')) {
    return BEGIN_NUMBER;
  }
  if (size >= kKeywordTrue.length() &&
      HasPrefixString(data_view, kKeywordTrue)) {
    return BEGIN_TRUE;
  }
  if (size >= kKeywordFalse.length() &&
      HasPrefixString(data_view, kKeywordFalse)) {
    return BEGIN_FALSE;
  }
  if (size >= kKeywordNull.length() &&
      HasPrefixString(data_view, kKeywordNull)) {
    return BEGIN_NULL;
  }
  if (*data == '{') return BEGIN_OBJECT;
  if (*data == '}') return END_OBJECT;
  if (*data == '[') return BEGIN_ARRAY;
  if (*data == ']') return END_ARRAY;
  if (*data == ':') return ENTRY_SEPARATOR;
  if (*data == ',') return VALUE_SEPARATOR;
  if (MatchKey(p_)) {
    return BEGIN_KEY;
  }

  // We don't know that we necessarily have an invalid token here, just that we
  // can't parse what we have so far. So we don't report an error and just
  // return UNKNOWN so we can try again later when we have more data, or if we
  // finish and we have leftovers.
  return UNKNOWN;
}